

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseCompressedBase.h
# Opt level: O0

void __thiscall
Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::InnerIterator::InnerIterator
          (InnerIterator *this,SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_> *mat,
          Index outer)

{
  long lVar1;
  bool bVar2;
  Scalar *pSVar3;
  StorageIndex *pSVar4;
  Index outer_local;
  SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_> *mat_local;
  InnerIterator *this_local;
  
  pSVar3 = valuePtr(mat);
  this->m_values = pSVar3;
  pSVar4 = innerIndexPtr(mat);
  this->m_indices = pSVar4;
  internal::variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_outer,outer);
  pSVar4 = outerIndexPtr(mat);
  this->m_id = (long)pSVar4[outer];
  bVar2 = isCompressed(mat);
  if (bVar2) {
    pSVar4 = outerIndexPtr(mat);
    this->m_end = (long)pSVar4[outer + 1];
  }
  else {
    lVar1 = this->m_id;
    pSVar4 = innerNonZeroPtr(mat);
    this->m_end = lVar1 + pSVar4[outer];
  }
  return;
}

Assistant:

InnerIterator(const SparseCompressedBase& mat, Index outer)
      : m_values(mat.valuePtr()), m_indices(mat.innerIndexPtr()), m_outer(outer)
    {
      if(Derived::IsVectorAtCompileTime && mat.outerIndexPtr()==0)
      {
        m_id = 0;
        m_end = mat.nonZeros();
      }
      else
      {
        m_id = mat.outerIndexPtr()[outer];
        if(mat.isCompressed())
          m_end = mat.outerIndexPtr()[outer+1];
        else
          m_end = m_id + mat.innerNonZeroPtr()[outer];
      }
    }